

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

int __thiscall
QAccessibleComboBox::indexOfChild(QAccessibleComboBox *this,QAccessibleInterface *child)

{
  bool bVar1;
  QComboBox *this_00;
  QAbstractItemView *pQVar2;
  QAbstractItemView *pQVar3;
  QLineEdit *pQVar4;
  QLineEdit *pQVar5;
  int iVar6;
  
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QComboBox *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  iVar6 = -1;
  if (this_00 != (QComboBox *)0x0) {
    pQVar2 = QComboBox::view(this_00);
    pQVar3 = (QAbstractItemView *)(**(code **)(*(long *)child + 0x18))(child);
    if (pQVar2 == pQVar3) {
      iVar6 = 0;
    }
    else {
      bVar1 = QComboBox::isEditable(this_00);
      if (bVar1) {
        pQVar4 = QComboBox::lineEdit(this_00);
        pQVar5 = (QLineEdit *)(**(code **)(*(long *)child + 0x18))(child);
        iVar6 = (uint)(pQVar4 == pQVar5) * 2 + -1;
      }
    }
  }
  return iVar6;
}

Assistant:

int QAccessibleComboBox::indexOfChild(const QAccessibleInterface *child) const
{
    if (QComboBox *cBox = comboBox()) {
        if (cBox->view() == child->object())
            return 0;
        if (cBox->isEditable() && cBox->lineEdit() == child->object())
            return 1;
    }
    return -1;
}